

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# producer.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int fd_00;
  char local_46 [8];
  char message [10];
  int i;
  Message *msg;
  int fd;
  int openFlags;
  mode_t mode;
  char *sharedFileName;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  fd_00 = open("shared.dat",0x242,0x1b6);
  if (fd_00 == -1) {
    printf("open returned (-1)\n");
    argv_local._4_4_ = -1;
  }
  else {
    register0x00000000 = Message::CopyToMemoryMappedFile(fd_00);
    message[2] = '\0';
    message[3] = '\0';
    message[4] = '\0';
    message[5] = '\0';
    for (; (int)message._2_4_ < 100; message._2_4_ = message._2_4_ + 1) {
      sprintf(local_46,"%d\n",(ulong)(uint)message._2_4_);
      Message::EnqueueMessage(stack0xffffffffffffffc8,local_46);
      printf("enqueued %d\n",(ulong)(uint)message._2_4_);
    }
    printf("message queue written\n");
    getchar();
    Message::ReleaseFile(stack0xffffffffffffffc8,fd_00);
    close(fd_00);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{

    const char *sharedFileName = "shared.dat";
    const mode_t mode = 0666;
    const int openFlags = (O_CREAT | O_TRUNC | O_RDWR);
    int fd = open(sharedFileName, openFlags, mode);

    if(fd == (-1))
    {
        printf("open returned (-1)\n");
        return (-1);
    }

    Message* msg = Message::CopyToMemoryMappedFile(fd);

    for(int i = 0; i < 100; i++)
    {
        char message[10];
        sprintf(message, "%d\n", i);
        msg->EnqueueMessage(&message[0]);
        printf("enqueued %d\n", i);
    }

    printf("message queue written\n");
    getchar();

    Message::ReleaseFile(msg, fd);

    close(fd);
}